

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O2

void __thiscall
JumpBasicOverride::buildLabels
          (JumpBasicOverride *this,Funcdata *fd,
          vector<Address,_std::allocator<Address>_> *addresstable,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *label,JumpModel *orig)

{
  pointer puVar1;
  uint uVar2;
  uintb addr;
  allocator local_61 [9];
  uintb local_58;
  string local_50;
  
  uVar2 = 0;
  do {
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->values).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= (ulong)uVar2) break;
    local_58 = JumpBasic::backup2Switch
                         (fd,puVar1[uVar2],(this->super_JumpBasic).normalvn,
                          (this->super_JumpBasic).switchvn);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(label,&local_58);
    uVar2 = uVar2 + 1;
  } while ((ulong)((long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3) <
           (ulong)((long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 4));
  while ((ulong)((long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(label->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3) <
         (ulong)((long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>)._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>)._M_impl
                       .super__Vector_impl_data._M_start >> 4)) {
    std::__cxx11::string::string((string *)&local_50,"Bad switch case",local_61);
    Funcdata::warning(fd,&local_50,
                      (Address *)
                      (((long)(label->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(label->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start) * 2 +
                      (long)(addresstable->super__Vector_base<Address,_std::allocator<Address>_>).
                            _M_impl.super__Vector_impl_data._M_start));
    std::__cxx11::string::~string((string *)&local_50);
    local_50._M_dataplus._M_p = (pointer)0xbad1abe1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (label,(unsigned_long *)&local_50);
  }
  return;
}

Assistant:

void JumpBasicOverride::buildLabels(Funcdata *fd,vector<Address> &addresstable,vector<uintb> &label,const JumpModel *orig) const

{
  uintb addr;

  for(uint4 i=0;i<values.size();++i) {
    try {
      addr = backup2Switch(fd,values[i],normalvn,switchvn);
    } catch(EvaluationError &err) {
      addr = 0xBAD1ABE1;
    }
    label.push_back(addr);
    if (label.size() >= addresstable.size()) break; // This should never happen
  }

  while(label.size() < addresstable.size()) {
    fd->warning("Bad switch case",addresstable[label.size()]); // This should never happen
    label.push_back(0xBAD1ABE1);
  }
}